

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O0

bool duckdb::Timestamp::TryFromDatetime(date_t date,dtime_t time,timestamp_t *result)

{
  bool bVar1;
  int64_t *in_RDX;
  timestamp_t in_RSI;
  int in_EDI;
  undefined1 local_1;
  
  bVar1 = TryMultiplyOperator::Operation<long,_long,_long>((long)in_EDI,86400000000,in_RDX);
  if (bVar1) {
    bVar1 = TryAddOperator::Operation<long,_long,_long>(*in_RDX,in_RSI.value,in_RDX);
    if (bVar1) {
      local_1 = IsFinite(in_RSI);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Timestamp::TryFromDatetime(date_t date, dtime_t time, timestamp_t &result) {
	if (!TryMultiplyOperator::Operation<int64_t, int64_t, int64_t>(date.days, Interval::MICROS_PER_DAY, result.value)) {
		return false;
	}
	if (!TryAddOperator::Operation<int64_t, int64_t, int64_t>(result.value, time.micros, result.value)) {
		return false;
	}
	return Timestamp::IsFinite(result);
}